

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_50 [8];
  FtpServer ftpServer;
  
  ftpServer.mConnection._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  gnl::FtpServer::FtpServer((FtpServer *)local_50,0x15,(char *)0x0);
  gnl::FtpServer::start((FtpServer *)local_50);
  ftpServer.mConnection._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  gnl::FtpServer::~FtpServer((FtpServer *)local_50);
  return ftpServer.mConnection._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

int main() {
    //signal(SIGPIPE, SIG_IGN);
    gnl::FtpServer ftpServer(21);
    ftpServer.start();


    return 0;
}